

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O0

Ptr<TestObject> * __thiscall
RefCount::Ptr<TestObject>::operator=(Ptr<TestObject> *this,Ptr<TestObject> *other)

{
  uint64 uVar1;
  Ptr<TestObject> *other_local;
  Ptr<TestObject> *this_local;
  
  if (other->refObj != (Object *)0x0) {
    Atomic::increment(&other->refObj->ref);
  }
  if (((this->refObj != (Object *)0x0) &&
      (uVar1 = Atomic::decrement(&this->refObj->ref), uVar1 == 0)) &&
     (this->refObj != (Object *)0x0)) {
    (*this->refObj->_vptr_Object[1])();
  }
  this->refObj = other->refObj;
  this->obj = other->obj;
  return this;
}

Assistant:

Ptr& operator=(const Ptr& other)
    {
      if(other.refObj)
        Atomic::increment(other.refObj->ref);
      if(refObj && Atomic::decrement(refObj->ref) == 0)
        delete refObj;
      refObj = other.refObj;
      obj = other.obj;
      return *this;
    }